

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O2

bool slang::ast::checkFormatString
               (ASTContext *context,StringLiteral *arg,iterator *argIt,iterator argEnd)

{
  ulong uVar1;
  SourceLocation SVar2;
  function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)> onError;
  bool bVar3;
  function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
  onArg;
  function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> onText;
  undefined1 local_92;
  bool ok;
  iterator argEnd_local;
  string_view local_78;
  anon_class_8_1_ba1d5ea0 getRange;
  SourceLocation loc;
  ASTContext *local_58;
  anon_class_8_1_ba1d5ea0 *local_50;
  anon_class_8_1_ba1d5ea0 *local_48;
  iterator *local_40;
  iterator *local_38;
  ASTContext *local_30;
  bool *local_28;
  
  uVar1 = (arg->rawValue)._M_len;
  local_78 = arg->rawValue;
  argEnd_local._M_current = argEnd._M_current;
  if (1 < uVar1) {
    local_78 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_78,1,uVar1 - 2);
  }
  SVar2 = (arg->super_Expression).sourceRange.startLoc;
  loc = (SourceLocation)
        ((long)SVar2 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
        (ulong)(SVar2._0_4_ & 0xfffffff));
  getRange.loc = &loc;
  local_50 = &getRange;
  local_28 = &ok;
  ok = true;
  local_38 = &argEnd_local;
  onError.callable = (intptr_t)&local_58;
  onError.callback =
       function_ref<void(slang::DiagCode,unsigned_long,unsigned_long,std::optional<char>)>::
       callback_fn<slang::ast::checkFormatString(slang::ast::ASTContext_const&,slang::ast::StringLiteral_const&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>)::__2>
  ;
  onArg.callable = (intptr_t)&local_48;
  onArg.callback =
       function_ref<void(char,unsigned_long,unsigned_long,slang::ast::SFormat::FormatOptions_const&)>
       ::
       callback_fn<slang::ast::checkFormatString(slang::ast::ASTContext_const&,slang::ast::StringLiteral_const&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>)::__1>
  ;
  onText.callable = (intptr_t)&local_92;
  onText.callback =
       function_ref<void(std::basic_string_view<char,std::char_traits<char>>)>::
       callback_fn<slang::ast::checkFormatString(slang::ast::ASTContext_const&,slang::ast::StringLiteral_const&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>)::__0>
  ;
  local_58 = context;
  local_48 = local_50;
  local_40 = argIt;
  local_30 = context;
  bVar3 = SFormat::parse(local_78,onText,onArg,onError);
  return (bool)(bVar3 & ok);
}

Assistant:

static bool checkFormatString(const ASTContext& context, const StringLiteral& arg,
                              Args::iterator& argIt, Args::iterator argEnd) {
    // Strip quotes from the raw string.
    std::string_view fmt = arg.getRawValue();
    if (fmt.length() >= 2)
        fmt = fmt.substr(1, fmt.length() - 2);

    SourceLocation loc = arg.sourceRange.start() + 1;
    auto getRange = [&](size_t offset, size_t len) {
        SourceLocation sl = loc + offset;
        return SourceRange{sl, sl + len};
    };

    bool ok = true;
    bool parseOk = SFormat::parse(
        fmt, [](std::string_view) {},
        [&](char spec, size_t offset, size_t len, const SFormat::FormatOptions&) {
            // Filter out non-consuming arguments.
            switch (charToLower(spec)) {
                case 'l':
                case 'm':
                    return;
                default:
                    break;
            }

            SourceRange range = getRange(offset, len);
            if (argIt == argEnd) {
                // If we've run out of arguments, this is an error.
                context.addDiag(diag::FormatNoArgument, range) << spec;
                ok = false;
                return;
            }

            auto arg = *argIt++;
            if (arg->kind == ExpressionKind::EmptyArgument) {
                // Empty arguments aren't allowed for format args.
                context.addDiag(diag::FormatEmptyArg, arg->sourceRange) << spec << range;
                ok = false;
                return;
            }

            ok &= checkArgType(context, *arg, spec, range);
        },
        [&](DiagCode code, size_t offset, size_t len, std::optional<char> specifier) {
            auto& diag = context.addDiag(code, getRange(offset, len));
            if (specifier)
                diag << *specifier;
        });

    return ok && parseOk;
}